

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  Curl_easy *pCVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  CURLcode CVar9;
  char *pcVar10;
  curl_off_t cVar11;
  long lVar12;
  ushort **ppuVar13;
  __off64_t _Var14;
  size_t len;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  undefined8 uVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  byte bVar22;
  size_t sVar23;
  bool bVar24;
  bool bVar25;
  timeval tVar26;
  long local_180;
  long local_170;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar20 = (data->state).buffer;
  *done = true;
  Curl_initinfo(data);
  Curl_pgrsStartNow(data);
  pCVar1 = conn->data;
  puVar2 = (undefined8 *)(pCVar1->req).protop;
  if ((data->set).upload != true) {
    iVar4 = *(int *)(puVar2 + 2);
    CVar5 = fstat64(iVar4,(stat64 *)&statbuf);
    cVar11 = statbuf.st_size;
    if (CVar5 == ~CURLE_OK) {
      cVar11 = 0;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var3 = Curl_meets_timecondition(data,(data->info).filetime), !_Var3)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data->set).opt_no_body == true) && (CVar5 != ~CURLE_OK)) &&
       ((data->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar5 = Curl_client_write(conn,3,header,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      CVar5 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      iVar4 = 6;
      if (buffer.tm_wday != 0) {
        iVar4 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar4],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar5 = Curl_client_write(conn,3,pcVar20,0);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      Curl_pgrsSetDownloadSize(data,cVar11);
      return CURLE_OK;
    }
    pCVar1 = conn->data;
    lVar21 = -1;
    lVar12 = 0xd0;
    if (((pCVar1->state).use_range == true) &&
       (pcVar19 = (pCVar1->state).range, pcVar19 != (char *)0x0)) {
      lVar21 = strtol(pcVar19,(char **)header,0);
      bVar22 = *(byte *)header._0_8_;
      pcVar19 = (char *)header._0_8_;
      if (bVar22 != 0) {
        ppuVar13 = __ctype_b_loc();
        do {
          if ((bVar22 != 0x2d) && (((*ppuVar13)[bVar22] & 0x2000) == 0)) break;
          bVar22 = pcVar19[1];
          pcVar19 = pcVar19 + 1;
        } while (bVar22 != 0);
      }
      header._0_8_ = pcVar19;
      lVar12 = strtol(pcVar19,(char **)&buffer,0);
      lVar16 = -1;
      if (pcVar19 != (char *)CONCAT44(buffer.tm_min,buffer.tm_sec)) {
        lVar16 = lVar12;
      }
      lVar12 = 0x4eb8;
      if (lVar16 != -1 || lVar21 < 0) {
        lVar16 = (lVar16 - lVar21) + 1;
        if (lVar21 < 0) {
          lVar16 = -lVar21;
        }
        (pCVar1->req).maxdownload = lVar16;
      }
    }
    *(long *)((long)pCVar1->sockets + lVar12 + -0x80) = lVar21;
    lVar21 = (data->state).resume_from;
    if (lVar21 < 0) {
      if (CVar5 == ~CURLE_OK) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      (data->state).resume_from = lVar21 + statbuf.st_size;
    }
    lVar21 = (data->state).resume_from;
    if (cVar11 < lVar21) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar24 = CVar5 == ~CURLE_OK;
    lVar12 = (data->req).maxdownload;
    local_180 = cVar11 - lVar21;
    if (0 < lVar12) {
      local_180 = lVar12;
    }
    bVar25 = local_180 == 0;
    if (CVar5 != ~CURLE_OK) {
      Curl_pgrsSetDownloadSize(data,local_180);
    }
    lVar21 = (data->state).resume_from;
    if (lVar21 != 0) {
      _Var14 = lseek64(iVar4,lVar21,0);
      CVar5 = CURLE_BAD_DOWNLOAD_RESUME;
      if (lVar21 != _Var14) {
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
    }
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar21 = 0;
    CVar9 = CURLE_OK;
    do {
      if (CVar9 != CURLE_OK) goto LAB_00582714;
      if (bVar24 || bVar25) {
        sVar23 = (data->set).buffer_size - 1;
      }
      else {
        sVar23 = (data->set).buffer_size;
        if (local_180 < (long)sVar23) {
          sVar23 = curlx_sotouz(local_180);
        }
      }
      len = read(iVar4,pcVar20,sVar23);
      if (0 < (long)len) {
        pcVar20[len] = '\0';
      }
      iVar6 = 3;
      CVar7 = CVar5;
      if ((0 < (long)len) && (local_180 != 0 || (bVar24 || bVar25))) {
        lVar21 = lVar21 + len;
        sVar17 = len;
        if (bVar24 || bVar25) {
          sVar17 = 0;
        }
        local_180 = local_180 - sVar17;
        iVar6 = 1;
        CVar7 = Curl_client_write(conn,1,pcVar20,len);
        CVar9 = CVar7;
        if (CVar7 == CURLE_OK) {
          Curl_pgrsSetDownloadCounter(data,lVar21);
          iVar8 = Curl_pgrsUpdate(conn);
          iVar6 = 0;
          CVar7 = CVar5;
          CVar9 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar8 == 0) {
            tVar26 = curlx_tvnow();
            CVar9 = Curl_speedcheck(data,tVar26);
          }
        }
      }
      CVar5 = CVar7;
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      return CVar7;
    }
LAB_00582714:
    iVar4 = Curl_pgrsUpdate(conn);
    if (iVar4 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    return CVar9;
  }
  pcVar20 = (char *)*puVar2;
  pcVar10 = strchr(pcVar20,0x2f);
  pcVar19 = (pCVar1->state).buffer;
  (pCVar1->req).upload_fromhere = pcVar19;
  if (pcVar10 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar10[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar4 = open64(pcVar20,(uint)((pCVar1->state).resume_from != 0) * 0x200 + 0x241,
                 (pCVar1->set).new_file_perms);
  if (iVar4 < 0) {
    uVar18 = *puVar2;
    pcVar20 = "Can\'t open %s for writing";
LAB_005827a8:
    Curl_failf(pCVar1,pcVar20,uVar18);
    CVar5 = CURLE_WRITE_ERROR;
  }
  else {
    lVar21 = (pCVar1->state).infilesize;
    if (lVar21 != -1) {
      Curl_pgrsSetUploadSize(pCVar1,lVar21);
    }
    if ((pCVar1->state).resume_from < 0) {
      iVar6 = fstat64(iVar4,(stat64 *)&statbuf);
      if (iVar6 != 0) {
        close(iVar4);
        uVar18 = *puVar2;
        pcVar20 = "Can\'t get the size of %s";
        goto LAB_005827a8;
      }
      (pCVar1->state).resume_from = statbuf.st_size;
    }
    CVar5 = CURLE_OK;
    local_170 = 0;
    do {
      if (CVar5 != CURLE_OK) break;
      CVar5 = Curl_fillreadbuffer(conn,(int)(pCVar1->set).buffer_size,(int *)header);
      if (CVar5 == CURLE_OK) {
        sVar23 = (size_t)(int)header._0_4_;
        CVar5 = CURLE_OK;
        if (0 < (long)sVar23) {
          lVar21 = (pCVar1->state).resume_from;
          pcVar20 = pcVar19;
          if (lVar21 != 0) {
            lVar12 = 0;
            if (lVar21 < (long)sVar23) {
              lVar12 = lVar21;
            }
            sVar15 = -(lVar21 - sVar23);
            cVar11 = lVar21 - sVar23;
            if (lVar21 < (long)sVar23) {
              cVar11 = 0;
            }
            else {
              sVar15 = 0;
            }
            (pCVar1->state).resume_from = cVar11;
            pcVar20 = pcVar19 + lVar12;
            sVar23 = sVar15;
          }
          sVar15 = write(iVar4,pcVar20,sVar23);
          if (sVar15 == sVar23) {
            local_170 = local_170 + sVar23;
            Curl_pgrsSetUploadCounter(pCVar1,local_170);
            iVar6 = Curl_pgrsUpdate(conn);
            bVar24 = true;
            CVar5 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar6 == 0) {
              tVar26 = curlx_tvnow();
              CVar5 = Curl_speedcheck(pCVar1,tVar26);
            }
            goto LAB_0058234f;
          }
          CVar5 = CURLE_SEND_ERROR;
        }
        bVar24 = false;
      }
      else {
        bVar24 = false;
      }
LAB_0058234f:
    } while (bVar24);
    if (CVar5 == CURLE_OK) {
      iVar6 = Curl_pgrsUpdate(conn);
      CVar5 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar6 == 0) {
        CVar5 = CURLE_OK;
      }
    }
    close(iVar4);
  }
  return CVar5;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool size_known;
  bool fstated=FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_tvnow());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}